

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O1

void showVersion(FILE *errStream,char *name)

{
  int iVar1;
  
  fprintf((FILE *)errStream,"%s: using libxml version %s\n",name,_xmlParserVersion);
  fwrite("   compiled with: ",0x12,1,(FILE *)errStream);
  iVar1 = xmlHasFeature(1);
  if (iVar1 != 0) {
    fwrite("Threads ",8,1,(FILE *)errStream);
  }
  iVar1 = xmlHasFeature(2);
  if (iVar1 != 0) {
    fwrite("Tree ",5,1,(FILE *)errStream);
  }
  iVar1 = xmlHasFeature(3);
  if (iVar1 != 0) {
    fwrite("Output ",7,1,(FILE *)errStream);
  }
  iVar1 = xmlHasFeature(4);
  if (iVar1 != 0) {
    fwrite("Push ",5,1,(FILE *)errStream);
  }
  iVar1 = xmlHasFeature(5);
  if (iVar1 != 0) {
    fwrite("Reader ",7,1,(FILE *)errStream);
  }
  iVar1 = xmlHasFeature(6);
  if (iVar1 != 0) {
    fwrite("Patterns ",9,1,(FILE *)errStream);
  }
  iVar1 = xmlHasFeature(7);
  if (iVar1 != 0) {
    fwrite("Writer ",7,1,(FILE *)errStream);
  }
  iVar1 = xmlHasFeature(8);
  if (iVar1 != 0) {
    fwrite("SAXv1 ",6,1,(FILE *)errStream);
  }
  iVar1 = xmlHasFeature(10);
  if (iVar1 != 0) {
    fwrite("HTTP ",5,1,(FILE *)errStream);
  }
  iVar1 = xmlHasFeature(0xb);
  if (iVar1 != 0) {
    fwrite("DTDValid ",9,1,(FILE *)errStream);
  }
  iVar1 = xmlHasFeature(0xc);
  if (iVar1 != 0) {
    fwrite("HTML ",5,1,(FILE *)errStream);
  }
  iVar1 = xmlHasFeature(0xd);
  if (iVar1 != 0) {
    fwrite("Legacy ",7,1,(FILE *)errStream);
  }
  iVar1 = xmlHasFeature(0xe);
  if (iVar1 != 0) {
    fwrite("C14N ",5,1,(FILE *)errStream);
  }
  iVar1 = xmlHasFeature(0xf);
  if (iVar1 != 0) {
    fwrite("Catalog ",8,1,(FILE *)errStream);
  }
  iVar1 = xmlHasFeature(0x10);
  if (iVar1 != 0) {
    fwrite("XPath ",6,1,(FILE *)errStream);
  }
  iVar1 = xmlHasFeature(0x11);
  if (iVar1 != 0) {
    fwrite("XPointer ",9,1,(FILE *)errStream);
  }
  iVar1 = xmlHasFeature(0x12);
  if (iVar1 != 0) {
    fwrite("XInclude ",9,1,(FILE *)errStream);
  }
  iVar1 = xmlHasFeature(0x13);
  if (iVar1 != 0) {
    fwrite("Iconv ",6,1,(FILE *)errStream);
  }
  iVar1 = xmlHasFeature(0x20);
  if (iVar1 != 0) {
    fwrite("ICU ",4,1,(FILE *)errStream);
  }
  iVar1 = xmlHasFeature(0x14);
  if (iVar1 != 0) {
    fwrite("ISO8859X ",9,1,(FILE *)errStream);
  }
  iVar1 = xmlHasFeature(0x15);
  if (iVar1 != 0) {
    fwrite("Unicode ",8,1,(FILE *)errStream);
  }
  iVar1 = xmlHasFeature(0x16);
  if (iVar1 != 0) {
    fwrite("Regexps ",8,1,(FILE *)errStream);
  }
  iVar1 = xmlHasFeature(0x17);
  if (iVar1 != 0) {
    fwrite("Automata ",9,1,(FILE *)errStream);
  }
  iVar1 = xmlHasFeature(0x18);
  if (iVar1 != 0) {
    fwrite("Expr ",5,1,(FILE *)errStream);
  }
  iVar1 = xmlHasFeature(0x22);
  if (iVar1 != 0) {
    fwrite("RelaxNG ",8,1,(FILE *)errStream);
  }
  iVar1 = xmlHasFeature(0x19);
  if (iVar1 != 0) {
    fwrite("Schemas ",8,1,(FILE *)errStream);
  }
  iVar1 = xmlHasFeature(0x1a);
  if (iVar1 != 0) {
    fwrite("Schematron ",0xb,1,(FILE *)errStream);
  }
  iVar1 = xmlHasFeature(0x1b);
  if (iVar1 != 0) {
    fwrite("Modules ",8,1,(FILE *)errStream);
  }
  iVar1 = xmlHasFeature(0x1c);
  if (iVar1 != 0) {
    fwrite("Debug ",6,1,(FILE *)errStream);
  }
  iVar1 = xmlHasFeature(0x1f);
  if (iVar1 != 0) {
    fwrite("Zlib ",5,1,(FILE *)errStream);
  }
  iVar1 = xmlHasFeature(0x21);
  if (iVar1 != 0) {
    fwrite("Lzma ",5,1,(FILE *)errStream);
  }
  fputc(10,(FILE *)errStream);
  return;
}

Assistant:

static void showVersion(FILE *errStream, const char *name) {
    fprintf(errStream, "%s: using libxml version %s\n", name, xmlParserVersion);
    fprintf(errStream, "   compiled with: ");
    if (xmlHasFeature(XML_WITH_THREAD)) fprintf(errStream, "Threads ");
    if (xmlHasFeature(XML_WITH_TREE)) fprintf(errStream, "Tree ");
    if (xmlHasFeature(XML_WITH_OUTPUT)) fprintf(errStream, "Output ");
    if (xmlHasFeature(XML_WITH_PUSH)) fprintf(errStream, "Push ");
    if (xmlHasFeature(XML_WITH_READER)) fprintf(errStream, "Reader ");
    if (xmlHasFeature(XML_WITH_PATTERN)) fprintf(errStream, "Patterns ");
    if (xmlHasFeature(XML_WITH_WRITER)) fprintf(errStream, "Writer ");
    if (xmlHasFeature(XML_WITH_SAX1)) fprintf(errStream, "SAXv1 ");
    if (xmlHasFeature(XML_WITH_HTTP)) fprintf(errStream, "HTTP ");
    if (xmlHasFeature(XML_WITH_VALID)) fprintf(errStream, "DTDValid ");
    if (xmlHasFeature(XML_WITH_HTML)) fprintf(errStream, "HTML ");
    if (xmlHasFeature(XML_WITH_LEGACY)) fprintf(errStream, "Legacy ");
    if (xmlHasFeature(XML_WITH_C14N)) fprintf(errStream, "C14N ");
    if (xmlHasFeature(XML_WITH_CATALOG)) fprintf(errStream, "Catalog ");
    if (xmlHasFeature(XML_WITH_XPATH)) fprintf(errStream, "XPath ");
    if (xmlHasFeature(XML_WITH_XPTR)) fprintf(errStream, "XPointer ");
    if (xmlHasFeature(XML_WITH_XINCLUDE)) fprintf(errStream, "XInclude ");
    if (xmlHasFeature(XML_WITH_ICONV)) fprintf(errStream, "Iconv ");
    if (xmlHasFeature(XML_WITH_ICU)) fprintf(errStream, "ICU ");
    if (xmlHasFeature(XML_WITH_ISO8859X)) fprintf(errStream, "ISO8859X ");
    if (xmlHasFeature(XML_WITH_UNICODE)) fprintf(errStream, "Unicode ");
    if (xmlHasFeature(XML_WITH_REGEXP)) fprintf(errStream, "Regexps ");
    if (xmlHasFeature(XML_WITH_AUTOMATA)) fprintf(errStream, "Automata ");
    if (xmlHasFeature(XML_WITH_EXPR)) fprintf(errStream, "Expr ");
    if (xmlHasFeature(XML_WITH_RELAXNG)) fprintf(errStream, "RelaxNG ");
    if (xmlHasFeature(XML_WITH_SCHEMAS)) fprintf(errStream, "Schemas ");
    if (xmlHasFeature(XML_WITH_SCHEMATRON)) fprintf(errStream, "Schematron ");
    if (xmlHasFeature(XML_WITH_MODULES)) fprintf(errStream, "Modules ");
    if (xmlHasFeature(XML_WITH_DEBUG)) fprintf(errStream, "Debug ");
    if (xmlHasFeature(XML_WITH_ZLIB)) fprintf(errStream, "Zlib ");
    if (xmlHasFeature(XML_WITH_LZMA)) fprintf(errStream, "Lzma ");
    fprintf(errStream, "\n");
}